

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O2

void __thiscall tst_qpromise_finally::fulfilledThrows_void(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  char16_t *pcVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  bool bVar4;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<void> *this_01;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_150;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_140;
  _Any_data local_138;
  undefined **local_128;
  PromiseData<void> *local_120;
  QPromiseBase<void> local_118;
  QArrayDataPointer<char16_t> local_108;
  PromiseResolver<void> resolver;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c0;
  QPromise<void> p_1;
  function<void_()> local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<void> local_30;
  
  QtPromise::QPromise<void>::resolve();
  p_1.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)local_30.m_d;
  if (local_30.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  local_108.d = (Data *)&PTR__QPromiseBase_00126ad0;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00126a88;
  local_108.ptr = (char16_t *)this_00;
  local_98.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_98);
  QVar3 = p_1.super_QPromiseBase<void>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_150.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_150 = resolver.m_d.d;
  }
  local_140.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_150.d != (Data *)0x0) {
    LOCK();
    ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_138._M_unused._0_8_ = resolver.m_d.d;
  local_138._8_8_ = local_150.d;
  local_118._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_138._M_unused._M_object;
  if ((Data *)local_138._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._M_unused._0_8_ = *local_138._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_138._8_8_;
  if ((Data *)local_138._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
    UNLOCK();
  }
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<void,tst_qpromise_finally::fulfilledThrows_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_finally::fulfilledThrows_void()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_138._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar3 = p_1.super_QPromiseBase<void>.m_d;
  local_138._M_unused._M_object = local_118._vptr_QPromiseBase;
  if ((Data *)local_118._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_118._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_118._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138._8_8_ = local_150.d;
  if (local_150.d != (Data *)0x0) {
    LOCK();
    ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_138._M_unused._M_object;
  if ((Data *)local_138._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._M_unused._0_8_ = *local_138._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_138._8_8_;
  if ((Data *)local_138._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
    UNLOCK();
  }
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<void,tst_qpromise_finally::fulfilledThrows_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_finally::fulfilledThrows_void()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_138._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_150);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_108.d = (Data *)&PTR__QPromiseBase_00126a88;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  local_118.m_d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       p_1.super_QPromiseBase<void>.m_d.d;
  if (p_1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126ad0;
  this_01 = (PromiseData<void> *)operator_new(0x58);
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_01->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00126a88;
  p.super_QPromiseBase<void>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  pcVar2 = local_108.ptr;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_150.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_150 = resolver_1.m_d.d;
  }
  local_140.d = (Data *)0x0;
  if (local_150.d == (Data *)0x0) {
    local_138._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_138._8_8_ = local_150.d;
  }
  local_c8.d = (Data *)0x0;
  if (local_150.d != (Data *)0x0) {
    LOCK();
    ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_138._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_138._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_138._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120 = local_118.m_d.d;
  if (local_118.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = &PTR__QPromiseBase_00126a88;
  local_98.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98._M_invoker = (_Invoker_type)0x0;
  local_138._M_unused._0_8_ = (undefined8)local_150.d;
  local_c0.d = (Data *)local_138._8_8_;
  local_98.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_98.super__Function_base._M_functor._M_unused._0_8_ = local_138._M_unused._M_object
  ;
  if ((Data *)local_138._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._M_unused._0_8_ = *local_138._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_138._8_8_;
  if ((Data *)local_138._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126ad0;
  *(PromiseData<void> **)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_120;
  if (local_120 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(local_120->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126a88;
  local_98._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<void>::finally<tst_qpromise_finally::fulfilledThrows_void()::$_0>(tst_qpromise_finally::fulfilledThrows_void()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<void>::finally<tst_qpromise_finally::fulfilledThrows_void()::$_0>(tst_qpromise_finally::fulfilledThrows_void()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_138._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)pcVar2,&local_98);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  pcVar2 = local_108.ptr;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_138,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_150,
             (QPromiseResolve<void> *)&local_c0,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)pcVar2,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_c0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_150);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_108.ptr);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_108.ptr);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_118);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_108);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p_1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_30);
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  p_1.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)0x0;
  waitForError<QString>((QString *)&resolver,&p,(QString *)&p_1);
  QString::QString((QString *)&local_108,"bar");
  bVar4 = QTest::qCompare((QString *)&resolver,(QString *)&local_108,"waitForError(p, QString{})",
                          "QString{\"bar\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x51);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_1);
  if (bVar4) {
    bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isRejected
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = bVar4;
    p_1.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,1);
    QTest::qCompare<bool,bool>
              ((bool *)&resolver,(bool *)&p_1,"p.isRejected()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
               ,0x52);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledThrows_void()
{
    auto p = QtPromise::QPromise<void>::resolve().finally([&]() {
        throw QString{"bar"};
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"bar"});
    QCOMPARE(p.isRejected(), true);
}